

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recall_tree.cc
# Opt level: O3

void recall_tree_ns::insert_example_at_node(recall_tree *b,uint32_t cn,example *ec)

{
  double dVar1;
  double dVar2;
  node_pred *pnVar3;
  node_pred *pnVar4;
  undefined4 uVar5;
  uint32_t uVar6;
  undefined4 uVar7;
  node_pred *pnVar8;
  node *pnVar9;
  
  pnVar8 = find_or_create(b,cn,ec);
  dVar1 = updated_entropy(b,cn,ec);
  (b->nodes)._begin[cn].entropy = dVar1;
  pnVar8->label_count = (double)ec->weight + pnVar8->label_count;
  pnVar9 = (b->nodes)._begin;
  if ((pnVar8 != pnVar9[cn].preds._begin) &&
     (pnVar8[-1].label_count <= pnVar8->label_count && pnVar8->label_count != pnVar8[-1].label_count
     )) {
    do {
      uVar6 = pnVar8[-1].label;
      uVar7 = *(undefined4 *)&pnVar8[-1].field_0x4;
      dVar1 = pnVar8[-1].label_count;
      uVar5 = *(undefined4 *)&pnVar8->field_0x4;
      dVar2 = pnVar8->label_count;
      pnVar8[-1].label = pnVar8->label;
      *(undefined4 *)&pnVar8[-1].field_0x4 = uVar5;
      pnVar8[-1].label_count = dVar2;
      pnVar8->label = uVar6;
      *(undefined4 *)&pnVar8->field_0x4 = uVar7;
      pnVar8->label_count = dVar1;
      pnVar9 = (b->nodes)._begin;
      if (pnVar8 + -1 == pnVar9[cn].preds._begin) break;
      pnVar3 = pnVar8 + -1;
      pnVar4 = pnVar8 + -2;
      pnVar8 = pnVar8 + -1;
    } while (pnVar4->label_count <= pnVar3->label_count &&
             pnVar3->label_count != pnVar4->label_count);
  }
  pnVar9[cn].n = (double)ec->weight + pnVar9[cn].n;
  compute_recall_lbest(b,(b->nodes)._begin + cn);
  return;
}

Assistant:

void insert_example_at_node(recall_tree& b, uint32_t cn, example& ec)
{
  node_pred* ls = find_or_create(b, cn, ec);

  b.nodes[cn].entropy = updated_entropy(b, cn, ec);

  ls->label_count += ec.weight;

  while (ls != b.nodes[cn].preds.begin() && ls[-1].label_count < ls[0].label_count)
  {
    std::swap(ls[-1], ls[0]);
    --ls;
  }

  b.nodes[cn].n += ec.weight;

  compute_recall_lbest(b, &b.nodes[cn]);
}